

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRemove
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  bool bVar1;
  pointer __rhs;
  string fileName;
  string message;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  do {
    __rhs = __rhs + 1;
    if (__rhs == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&local_70);
      return true;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)__rhs);
    bVar1 = cmsys::SystemTools::FileIsFullPath(local_90._M_dataplus._M_p);
    if (!bVar1) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&local_90);
      std::operator+(&local_50,"/",__rhs);
      std::__cxx11::string::append((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(&local_90);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsSymlink(&local_90);
      if (bVar1 || !recurse) goto LAB_00302ee3;
      cmsys::SystemTools::RemoveADirectory(&local_90);
    }
    else {
LAB_00302ee3:
      cmsys::SystemTools::RemoveFile(&local_90);
    }
    std::__cxx11::string::~string((string *)&local_90);
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRemove(std::vector<std::string> const& args,
                                 bool recurse)
{

  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand
  for(;i != args.end(); ++i)
    {
    std::string fileName = *i;
    if(!cmsys::SystemTools::FileIsFullPath(fileName.c_str()))
      {
      fileName = this->Makefile->GetCurrentSourceDirectory();
      fileName += "/" + *i;
      }

    if(cmSystemTools::FileIsDirectory(fileName) &&
       !cmSystemTools::FileIsSymlink(fileName) && recurse)
      {
      cmSystemTools::RemoveADirectory(fileName);
      }
    else
      {
      cmSystemTools::RemoveFile(fileName);
      }
    }
  return true;
}